

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegAudioStreamReader.cpp
# Opt level: O1

string * __thiscall
MpegAudioStreamReader::getStreamInfo_abi_cxx11_
          (string *__return_storage_ptr__,MpegAudioStreamReader *this)

{
  ostream *poVar1;
  ostringstream str;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Bitrate: ",9);
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)local_190,(this->super_MP3Codec).m_bit_rate / 1000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Kbps  ",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Sample Rate: ",0xd);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)local_190,(this->super_MP3Codec).m_sample_rate / 1000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"KHz  ",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Channels: ",10);
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)local_190,(this->super_MP3Codec).m_nb_channels);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Layer: ",7);
  std::ostream::operator<<((ostream *)local_190,(int)(this->super_MP3Codec).m_layer);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

const std::string MpegAudioStreamReader::getStreamInfo()
{
    std::ostringstream str;
    str << "Bitrate: " << m_bit_rate / 1000 << "Kbps  ";
    str << "Sample Rate: " << m_sample_rate / 1000 << "KHz  ";
    str << "Channels: " << m_nb_channels << "  ";
    str << "Layer: " << static_cast<int>(m_layer);
    return str.str();
}